

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v8::detail::check_int_type_spec<fmt::v8::detail::error_handler&>
               (char spec,error_handler *eh)

{
  int iVar1;
  char in_DIL;
  error_handler *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff8;
  
  iVar1 = (int)in_DIL;
  if ((((in_DIL != '\0') && (iVar1 != 0x42)) && (iVar1 != 0x58)) &&
     (((2 < iVar1 - 0x62U && (iVar1 != 0x6f)) && (iVar1 != 0x78)))) {
    error_handler::on_error(unaff_retaddr,(char *)CONCAT17(in_DIL,in_stack_fffffffffffffff8));
  }
  return;
}

Assistant:

FMT_CONSTEXPR void check_int_type_spec(char spec, ErrorHandler&& eh) {
  switch (spec) {
  case 0:
  case 'd':
  case 'x':
  case 'X':
  case 'b':
  case 'B':
  case 'o':
  case 'c':
    break;
  default:
    eh.on_error("invalid type specifier");
    break;
  }
}